

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_SetWeapon(FParser *this)

{
  AActor *this_00;
  PClass *pPVar1;
  uint uVar2;
  int iVar3;
  char *name;
  PClassActor *type;
  AWeapon *this_01;
  undefined4 extraout_var;
  long lVar5;
  AWeapon *weap;
  AWeapon *pAVar6;
  bool bVar7;
  PClass *pPVar4;
  
  if (this->t_argc < 2) {
    script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
    return;
  }
  uVar2 = T_GetPlayerNum(this->t_argv);
  if (uVar2 != 0xffffffff) {
    lVar5 = (ulong)uVar2 * 0x2a0;
    this_00 = (AActor *)(&players)[(ulong)uVar2 * 0x54];
    name = stringvalue(this->t_argv + 1);
    type = PClass::FindActor(name);
    this_01 = (AWeapon *)AActor::FindInventory(this_00,type,false);
    pPVar1 = AWeapon::RegistrationInfo.MyClass;
    if (this_01 != (AWeapon *)0x0) {
      pPVar4 = (this_01->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
               super_DObject.Class;
      if (pPVar4 == (PClass *)0x0) {
        iVar3 = (**(this_01->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                   super_DObject._vptr_DObject)(this_01);
        pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
        (this_01->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
        Class = pPVar4;
      }
      bVar7 = pPVar4 != (PClass *)0x0;
      if (pPVar4 != pPVar1 && bVar7) {
        do {
          pPVar4 = pPVar4->ParentClass;
          bVar7 = pPVar4 != (PClass *)0x0;
          if (pPVar4 == pPVar1) break;
        } while (pPVar4 != (PClass *)0x0);
      }
      if ((bVar7) &&
         ((pAVar6 = (AWeapon *)AWeapon::RegistrationInfo.MyClass,
          *(AWeapon **)(&DAT_017e1f10 + lVar5) == this_01 ||
          (bVar7 = AWeapon::CheckAmmo(this_01,2,false,false,-1), pAVar6 = this_01, bVar7)))) {
        *(AWeapon **)(&DAT_017e1f18 + lVar5) = pAVar6;
      }
    }
  }
  (this->t_return).value.i = 0;
  return;
}

Assistant:

void FParser::SF_SetWeapon()
{
	if (CheckArgs(2))
	{
		int playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum!=-1) 
		{
			AInventory *item = players[playernum].mo->FindInventory (PClass::FindActor (stringvalue(t_argv[1])));

			if (item == NULL || !item->IsKindOf (RUNTIME_CLASS(AWeapon)))
			{
			}
			else if (players[playernum].ReadyWeapon == item)
			{
				// The weapon is already selected, so setweapon succeeds by default,
				// but make sure the player isn't switching away from it.
				players[playernum].PendingWeapon = WP_NOCHANGE;
				t_return.value.i = 1;
			}
			else
			{
				AWeapon *weap = static_cast<AWeapon *> (item);

				if (weap->CheckAmmo (AWeapon::EitherFire, false))
				{
					// There's enough ammo, so switch to it.
					t_return.value.i = 1;
					players[playernum].PendingWeapon = weap;
				}
			}
		}
		t_return.value.i = 0;
	}
}